

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

int sam_parse1(kstring_t *s,bam_hdr_t *h,bam1_t *b)

{
  undefined1 *puVar1;
  double dVar2;
  size_t sVar3;
  char *pcVar4;
  byte bVar5;
  int iVar6;
  int8_t *piVar7;
  long lVar8;
  uint8_t *puVar9;
  ushort **ppuVar10;
  uint uVar11;
  byte bVar12;
  ulong uVar13;
  size_t __n;
  ulong uVar14;
  kstring_t *pkVar15;
  ulong uVar16;
  int iVar17;
  uint8_t *puVar18;
  short sVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  double *pdVar23;
  double *pdVar24;
  double *pdVar25;
  char cVar26;
  size_t sVar27;
  float x_1;
  uint16_t y;
  kstring_t str;
  double *local_80;
  float local_74;
  double local_70;
  double *local_68;
  double *local_60;
  kstring_t *local_58;
  uint8_t *local_50;
  kstring_t local_48;
  
  pdVar25 = (double *)s->s;
  b->l_data = 0;
  local_48.l = 0;
  local_50 = b->data;
  uVar14 = (ulong)b->m_data;
  (b->core).l_qseq = 0;
  (b->core).mtid = 0;
  (b->core).mpos = 0;
  (b->core).isize = 0;
  (b->core).tid = 0;
  (b->core).pos = 0;
  *(undefined8 *)&(b->core).field_0x8 = 0;
  local_58 = s;
  local_48.m = uVar14;
  local_48.s = (char *)local_50;
  if (h->cigar_tab == (int8_t *)0x0) {
    piVar7 = (int8_t *)malloc(0x80);
    h->cigar_tab = piVar7;
    lVar8 = 0;
    do {
      h->cigar_tab[lVar8] = -1;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x80);
    lVar8 = 0;
    do {
      h->cigar_tab["MIDNSHP=XB"[lVar8]] = (int8_t)lVar8;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 10);
  }
  iVar6 = 0x1000000;
  lVar8 = 0x100000000;
  pdVar24 = pdVar25;
  while( true ) {
    pdVar23 = (double *)((long)pdVar24 + 1);
    if (*(char *)pdVar24 == '\0') break;
    if (*(char *)pdVar24 == '\t') {
      *(char *)pdVar24 = '\0';
      uVar16 = lVar8 >> 0x20;
      puVar9 = local_50;
      local_80 = pdVar25;
      local_68 = pdVar23;
      puVar18 = (uint8_t *)local_48.s;
      if (uVar14 < uVar16) {
        uVar14 = uVar16 - 1 >> 1 | uVar16 - 1;
        uVar14 = uVar14 >> 2 | uVar14;
        uVar14 = uVar14 >> 4 | uVar14;
        uVar14 = uVar14 >> 8 | uVar14;
        local_48.m = (uVar14 >> 0x10 | uVar14) + 1;
        puVar9 = (uint8_t *)realloc(local_50,local_48.m);
        puVar18 = puVar9;
        if (puVar9 != (uint8_t *)0x0) goto LAB_0013d74d;
        uVar16 = 0;
      }
      else {
LAB_0013d74d:
        local_48.s = (char *)puVar18;
        local_50 = puVar9;
        memcpy(puVar9,pdVar25,uVar16);
        local_48.l = uVar16;
      }
      (b->core).field_0xb = (char)((uint)iVar6 >> 0x18);
      lVar8 = strtol((char *)pdVar23,(char **)&local_68,0);
      *(short *)&(b->core).field_0xc = (short)lVar8;
      if (*(char *)local_68 == '\t') {
        local_80 = (double *)((long)local_68 + 1);
        pdVar25 = (double *)((long)local_68 + 2);
        goto LAB_0013d7a0;
      }
      break;
    }
    lVar8 = lVar8 + 0x100000000;
    iVar6 = iVar6 + 0x1000000;
    pdVar24 = pdVar23;
  }
LAB_0013dc0d:
  b->data = (uint8_t *)local_48.s;
  iVar6 = -2;
  iVar17 = (int)local_48.l;
LAB_0013dc20:
  b->l_data = iVar17;
  b->m_data = (int)local_48.m;
  return iVar6;
LAB_0013d7a0:
  if (*(char *)((long)pdVar25 + -1) != '\0') {
    if (*(char *)((long)pdVar25 + -1) != '\t') goto code_r0x0013d7b2;
    *(char *)((long)pdVar25 + -1) = '\0';
    if ((*(char *)local_80 == '*') && (*(char *)((long)local_68 + 2) == '\0')) {
      (b->core).tid = -1;
      local_68 = pdVar25;
    }
    else {
      if ((h->n_targets == 0) && (0 < hts_verbose)) {
        local_68 = pdVar25;
        sam_parse1_cold_2();
        goto LAB_0013dc0d;
      }
      local_68 = pdVar25;
      iVar6 = bam_name2id(h,(char *)local_80);
      (b->core).tid = iVar6;
      if ((iVar6 < 0) && (1 < hts_verbose)) {
        sam_parse1_cold_1();
      }
    }
    lVar8 = strtol((char *)pdVar25,(char **)&local_68,10);
    iVar6 = (int)lVar8 + -1;
    (b->core).pos = iVar6;
    pdVar25 = (double *)((long)local_68 + 1);
    if (*(char *)local_68 == '\t') {
      iVar17 = (b->core).tid;
      local_68 = pdVar25;
      if (iVar6 < 0) {
        if (-1 < iVar17) {
          if (1 < hts_verbose) {
            sam_parse1_cold_3();
          }
          (b->core).tid = -1;
        }
LAB_0013d86e:
        puVar1 = &(b->core).field_0xc;
        *puVar1 = *puVar1 | 4;
      }
      else if (iVar17 < 0) goto LAB_0013d86e;
      lVar8 = strtol((char *)pdVar25,(char **)&local_68,10);
      pdVar24 = local_68;
      uVar14 = *(ulong *)&(b->core).field_0x8;
      pdVar25 = (double *)(uVar14 & 0xffffffffff00ffff | (ulong)(((uint)lVar8 & 0xff) << 0x10));
      *(double **)&(b->core).field_0x8 = pdVar25;
      if (*(char *)local_68 == '\t') {
        pdVar23 = (double *)((long)local_68 + 1);
        cVar26 = *(char *)pdVar23;
        local_60 = pdVar25;
        if (cVar26 != '*') {
          uVar14 = 0;
          pdVar24 = (double *)((long)local_68 + 2);
          local_80 = pdVar23;
          while ((cVar26 != '\0' && (cVar26 != '\t'))) {
            ppuVar10 = __ctype_b_loc();
            uVar14 = uVar14 + ((*(byte *)((long)*ppuVar10 + (long)cVar26 * 2 + 1) & 8) == 0);
            cVar26 = *(char *)pdVar24;
            pdVar24 = (double *)((long)pdVar24 + 1);
          }
          if (cVar26 == '\t') {
            local_68 = pdVar24;
            if ((0xffff < uVar14) && (0 < hts_verbose)) {
              sam_parse1_cold_5();
              goto LAB_0013dc0d;
            }
            *(ulong *)&(b->core).field_0x8 = (ulong)local_60 & 0xffffffffffff | uVar14 << 0x30;
            ks_resize(&local_48,(uVar14 & 0xffff) * 4 + uVar16);
            pcVar4 = local_48.s;
            sVar3 = local_48.l;
            uVar14 = *(ulong *)&(b->core).field_0x8 >> 0x30;
            local_48.l = local_48.l + uVar14 * 4;
            local_50 = (uint8_t *)local_48.s;
            if (uVar14 == 0) {
LAB_0013da6b:
              iVar6 = 0;
            }
            else {
              uVar14 = 0;
              do {
                lVar8 = strtol((char *)pdVar23,(char **)&local_80,10);
                uVar20 = (int)lVar8 << 4;
                *(uint *)(pcVar4 + uVar14 * 4 + sVar3) = uVar20;
                if ((long)*(char *)local_80 < 0) {
                  uVar11 = 0xffffffff;
                }
                else {
                  uVar11 = (uint)h->cigar_tab[*(char *)local_80];
                }
                if (((int)uVar11 < 0) && (0 < hts_verbose)) {
                  sam_parse1_cold_4();
                  goto LAB_0013dc0d;
                }
                *(uint *)(pcVar4 + uVar14 * 4 + sVar3) = uVar11 | uVar20;
                uVar14 = uVar14 + 1;
                pdVar23 = (double *)((long)local_80 + 1);
                uVar16 = *(ulong *)&(b->core).field_0x8;
                uVar13 = uVar16 >> 0x30;
                local_80 = pdVar23;
              } while (uVar14 < uVar13);
              if (uVar16 < 0x1000000000000) goto LAB_0013da6b;
              uVar14 = 0;
              iVar6 = 0;
              do {
                iVar6 = iVar6 + (*(uint *)(pcVar4 + uVar14 * 4 + sVar3) >> 4 &
                                (int)((0x3c1a7U >>
                                      ((char)*(uint *)(pcVar4 + uVar14 * 4 + sVar3) * '\x02' & 0x1fU
                                      )) << 0x1e) >> 0x1f);
                uVar14 = uVar14 + 1;
              } while (uVar13 != uVar14);
            }
            goto LAB_0013daa5;
          }
          goto LAB_0013dc0d;
        }
        if (((uVar14 >> 0x22 & 1) == 0) && (1 < hts_verbose)) {
          fprintf(_stderr,"[W::%s] mapped query must have a CIGAR; treated as unmapped\n",
                  "sam_parse1");
          pdVar25 = *(double **)&(b->core).field_0x8;
        }
        *(ulong *)&(b->core).field_0x8 = (ulong)pdVar25 | 0x400000000;
        pdVar24 = (double *)((long)pdVar24 + 2);
        goto LAB_0013da7f;
      }
    }
  }
  goto LAB_0013dc0d;
LAB_0013da7f:
  if (*(char *)((long)pdVar24 + -1) == '\0') goto LAB_0013dc0d;
  if (*(char *)((long)pdVar24 + -1) != '\t') goto code_r0x0013da91;
  *(char *)((long)pdVar24 + -1) = '\0';
  iVar6 = 1;
LAB_0013daa5:
  lVar8 = (long)(b->core).pos;
  iVar17 = 0x1249;
  bVar5 = 0xe;
  uVar20 = 6;
  bVar12 = 0xc;
  sVar19 = 0;
  do {
    lVar22 = lVar8 >> (bVar5 & 0x3f);
    if (lVar22 == lVar8 + iVar6 + -1 >> (bVar5 & 0x3f)) {
      sVar19 = (short)iVar17 + (short)lVar22;
      break;
    }
    bVar5 = bVar5 + 3;
    iVar17 = iVar17 + (-1 << (bVar12 & 0x1f));
    uVar20 = uVar20 - 1;
    bVar12 = bVar12 - 3;
  } while (1 < uVar20);
  *(short *)&(b->core).field_0x8 = sVar19;
  pdVar25 = pdVar24;
  do {
    pdVar23 = pdVar25;
    pdVar25 = (double *)((long)pdVar23 + 1);
    if (*(char *)pdVar23 == '\0') goto LAB_0013dc0d;
  } while (*(char *)pdVar23 != '\t');
  *(char *)pdVar23 = '\0';
  local_80 = pdVar24;
  local_68 = pdVar25;
  if (*(char *)pdVar24 == '*') {
    if (*(char *)((long)pdVar24 + 1) != '\0') goto LAB_0013db69;
    iVar6 = -1;
  }
  else if ((*(char *)pdVar24 == '=') && (*(char *)((long)pdVar24 + 1) == '\0')) {
    iVar6 = (b->core).tid;
  }
  else {
LAB_0013db69:
    iVar6 = bam_name2id(h,(char *)pdVar24);
  }
  (b->core).mtid = iVar6;
  lVar8 = strtol((char *)pdVar25,(char **)&local_68,10);
  iVar6 = (int)lVar8 + -1;
  (b->core).mpos = iVar6;
  pdVar25 = (double *)((long)local_68 + 1);
  if (*(char *)local_68 != '\t') goto LAB_0013dc0d;
  local_68 = pdVar25;
  if ((iVar6 < 0) && (-1 < (b->core).mtid)) {
    if (1 < hts_verbose) {
      sam_parse1_cold_6();
    }
    (b->core).mtid = -1;
  }
  lVar8 = strtol((char *)pdVar25,(char **)&local_68,10);
  pdVar25 = local_68;
  (b->core).isize = (int32_t)lVar8;
  if (*(char *)local_68 != '\t') goto LAB_0013dc0d;
  lVar8 = 0;
  while( true ) {
    cVar26 = *(char *)((long)local_68 + lVar8 + 1);
    if (cVar26 == '\0') goto LAB_0013dc0d;
    if (cVar26 == '\t') break;
    lVar8 = lVar8 + 1;
  }
  pdVar24 = (double *)((long)local_68 + lVar8 + 2);
  *(char *)((long)local_68 + lVar8 + 1) = '\0';
  if ((*(char *)((long)local_68 + 1) == '*') && (*(char *)((long)local_68 + 2) == '\0')) {
    (b->core).l_qseq = 0;
  }
  else {
    iVar6 = (int)lVar8;
    (b->core).l_qseq = iVar6;
    uVar14 = *(ulong *)&(b->core).field_0x8;
    local_68 = pdVar24;
    if (uVar14 >> 0x30 != 0) {
      uVar16 = 0;
      iVar17 = 0;
      do {
        iVar21 = iVar17;
        uVar20 = *(uint *)(local_50 + uVar16 * 4 + (uVar14 >> 0x18 & 0xff)) >> 4 &
                 -(uint)((0x3c1a7U >>
                          (*(uint *)(local_50 + uVar16 * 4 + (uVar14 >> 0x18 & 0xff)) * 2 & 0x1f) &
                         1) != 0);
        uVar16 = uVar16 + 1;
        iVar17 = uVar20 + iVar21;
      } while (uVar14 >> 0x30 != uVar16);
      if (((0xffffffffffff < uVar14) && (uVar20 + iVar21 != iVar6)) && (0 < hts_verbose)) {
        sam_parse1_cold_7();
        goto LAB_0013dc0d;
      }
    }
    sVar27 = (size_t)(iVar6 + 1 >> 1);
    ks_resize(&local_48,local_48.l + sVar27);
    puVar9 = (uint8_t *)(local_48.s + local_48.l);
    local_48.l = local_48.l + sVar27;
    memset(puVar9,0,sVar27);
    if (0 < (b->core).l_qseq) {
      bVar5 = 0;
      uVar14 = 0;
      do {
        puVar9[uVar14 >> 1 & 0x7fffffff] =
             puVar9[uVar14 >> 1 & 0x7fffffff] |
             "\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x01\x02\x04\b\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f"
             [*(char *)((long)pdVar25 + uVar14 + 1)] << (~bVar5 & 4);
        uVar14 = uVar14 + 1;
        bVar5 = bVar5 + 4;
      } while ((long)uVar14 < (long)(b->core).l_qseq);
    }
  }
  sVar27 = 0;
  for (local_68 = (double *)((long)pdVar25 + lVar8 + 3);
      (*(char *)((long)local_68 + -1) != '\0' && (*(char *)((long)local_68 + -1) != '\t'));
      local_68 = (double *)((long)local_68 + 1)) {
    sVar27 = sVar27 + 1;
  }
  *(char *)((long)local_68 + -1) = '\0';
  local_80 = pdVar24;
  ks_resize(&local_48,(long)(b->core).l_qseq + local_48.l);
  puVar18 = (uint8_t *)local_48.s;
  puVar9 = (uint8_t *)(local_48.s + local_48.l);
  iVar6 = (b->core).l_qseq;
  __n = (size_t)iVar6;
  uVar14 = local_48.l + __n;
  local_48.l = uVar14;
  if ((*(char *)pdVar24 == '*') && (*(char *)((long)pdVar25 + lVar8 + 3) == '\0')) {
    memset(puVar9,0xff,__n);
  }
  else {
    if ((__n != sVar27) && (0 < hts_verbose)) {
      sam_parse1_cold_8();
      goto LAB_0013dc0d;
    }
    if (0 < iVar6) {
      lVar8 = 0;
      do {
        puVar9[lVar8] = *(char *)pdVar24 + 0xdf;
        lVar8 = lVar8 + 1;
        pdVar24 = (double *)((long)pdVar24 + 1);
      } while (lVar8 < (b->core).l_qseq);
    }
  }
  if (local_58->s + local_58->l <= local_68) goto LAB_0013e3d4;
  local_50 = "[E::%s] incomplete B-typed aux field\n";
  pkVar15 = local_58;
  pdVar25 = local_68;
LAB_0013de9b:
  for (uVar14 = 0;
      (*(char *)((long)pdVar25 + uVar14) != '\0' && (*(char *)((long)pdVar25 + uVar14) != '\t'));
      uVar14 = uVar14 + 1) {
  }
  pdVar24 = (double *)((char *)((long)pdVar25 + uVar14) + 1);
  *(char *)((long)pdVar25 + uVar14) = '\0';
  local_68 = pdVar24;
  if (((long)uVar14 < 6) && (0 < hts_verbose)) {
    sam_parse1_cold_10();
    goto LAB_0013dc0d;
  }
  kputsn_(pdVar25,2,&local_48);
  bVar5 = *(byte *)((long)pdVar25 + 3);
  pdVar23 = (double *)((long)pdVar25 + 5);
  local_80 = pdVar23;
  if ((0x22 < bVar5 - 0x41) || ((0x500000005U >> ((ulong)(bVar5 - 0x41) & 0x3f) & 1) == 0)) {
    if ((bVar5 & 0xdf) == 0x49) {
      if (*(char *)pdVar23 == '-') {
        uVar14 = strtol((char *)pdVar23,(char **)&local_80,10);
        if (-0x81 < (long)uVar14) {
          iVar6 = 99;
LAB_0013dfc9:
          kputc_(iVar6,&local_48);
          iVar6 = (int)uVar14;
          goto LAB_0013df22;
        }
        if (0xffffffffffff7fff < uVar14) {
          local_70 = (double)CONCAT62(local_70._2_6_,(short)uVar14);
          iVar6 = 0x73;
LAB_0013e034:
          kputc_(iVar6,&local_48);
          pdVar23 = &local_70;
          iVar6 = 2;
          goto LAB_0013e1b1;
        }
        local_70 = (double)CONCAT44(local_70._4_4_,(int)uVar14);
        iVar6 = 0x69;
      }
      else {
        uVar14 = strtoul((char *)pdVar23,(char **)&local_80,10);
        if (uVar14 < 0x100) {
          iVar6 = 0x43;
          goto LAB_0013dfc9;
        }
        if (uVar14 < 0x10000) {
          local_70 = (double)CONCAT62(local_70._2_6_,(short)uVar14);
          iVar6 = 0x53;
          goto LAB_0013e034;
        }
        local_70 = (double)CONCAT44(local_70._4_4_,(int)uVar14);
        iVar6 = 0x49;
      }
LAB_0013e19f:
      kputc_(iVar6,&local_48);
      pdVar23 = &local_70;
      iVar6 = 4;
LAB_0013e1b1:
      kputsn_(pdVar23,iVar6,&local_48);
      goto LAB_0013df2a;
    }
    if (0x59 < bVar5) {
      if (bVar5 == 0x5a) {
LAB_0013dfeb:
        kputc_((uint)bVar5,&local_48);
        iVar6 = (int)uVar14 + -4;
      }
      else {
        if (bVar5 != 100) {
          if (bVar5 == 0x66) {
            dVar2 = strtod((char *)pdVar23,(char **)&local_80);
            local_70 = (double)CONCAT44(local_70._4_4_,(float)dVar2);
            iVar6 = 0x66;
            goto LAB_0013e19f;
          }
          goto LAB_0013e0cc;
        }
        local_70 = strtod((char *)pdVar23,(char **)&local_80);
        kputc_(100,&local_48);
        pdVar23 = &local_70;
        iVar6 = 8;
      }
      goto LAB_0013e1b1;
    }
    if (bVar5 != 0x42) {
      if (bVar5 == 0x48) goto LAB_0013dfeb;
LAB_0013e0cc:
      if (0 < hts_verbose) {
        sam_parse1_cold_9();
        goto LAB_0013dc0d;
      }
      goto LAB_0013df2a;
    }
    if (((long)(4 - uVar14) < -3) || (hts_verbose < 1)) {
      local_60 = (double *)((long)pdVar25 + uVar14);
      pdVar23 = (double *)((long)pdVar25 + 6);
      bVar5 = *(byte *)((long)pdVar25 + 5);
      uVar20 = (uint)bVar5;
      iVar6 = 0;
      pdVar25 = pdVar23;
      do {
        if (*(char *)pdVar25 == ',') {
          iVar6 = iVar6 + 1;
        }
        else if (*(char *)pdVar25 == '\0') goto LAB_0013e0e1;
        pdVar25 = (double *)((long)pdVar25 + 1);
      } while( true );
    }
    goto LAB_0013e421;
  }
  kputc_(0x41,&local_48);
  iVar6 = (int)*(char *)pdVar23;
LAB_0013df22:
  kputc_(iVar6,&local_48);
  goto LAB_0013df2a;
code_r0x0013da91:
  pdVar24 = (double *)((long)pdVar24 + 1);
  goto LAB_0013da7f;
LAB_0013e0e1:
  local_70 = (double)CONCAT44((int)((ulong)local_70 >> 0x20),iVar6);
  local_80 = pdVar23;
  kputc_(0x42,&local_48);
  kputc_(uVar20,&local_48);
  kputsn_(&local_70,4,&local_48);
  pkVar15 = local_58;
  pdVar25 = local_60;
  if (bVar5 < 99) {
    if (uVar20 == 0x43) {
      if (6 < uVar14) {
        do {
          uVar14 = strtoul((char *)((long)pdVar23 + 1),(char **)&local_80,0);
          kputc_((uint)uVar14 & 0xff,&local_48);
          pdVar23 = local_80;
        } while (local_80 < pdVar25);
      }
      goto LAB_0013df2a;
    }
    if (uVar20 == 0x49) {
      if (6 < uVar14) {
        do {
          uVar14 = strtoul((char *)((long)pdVar23 + 1),(char **)&local_80,0);
          local_74 = (float)uVar14;
          kputsn_(&local_74,4,&local_48);
          pdVar23 = local_80;
        } while (local_80 < pdVar25);
      }
      goto LAB_0013df2a;
    }
    if (uVar20 == 0x53) {
      if (6 < uVar14) {
        do {
          uVar14 = strtoul((char *)((long)pdVar23 + 1),(char **)&local_80,0);
          local_74 = (float)CONCAT22(local_74._2_2_,(short)uVar14);
          kputsn_(&local_74,2,&local_48);
          pdVar23 = local_80;
        } while (local_80 < pdVar25);
      }
      goto LAB_0013df2a;
    }
  }
  else if (uVar20 == 0x68 || bVar5 < 0x68) {
    if (uVar20 == 99) {
      if (6 < uVar14) {
        do {
          lVar8 = strtol((char *)((long)pdVar23 + 1),(char **)&local_80,0);
          kputc_((int)(char)lVar8,&local_48);
          pdVar23 = local_80;
        } while (local_80 < pdVar25);
      }
      goto LAB_0013df2a;
    }
    if (uVar20 == 0x66) {
      if (6 < uVar14) {
        do {
          dVar2 = strtod((char *)((long)pdVar23 + 1),(char **)&local_80);
          local_74 = (float)dVar2;
          kputsn_(&local_74,4,&local_48);
          pdVar23 = local_80;
        } while (local_80 < pdVar25);
      }
      goto LAB_0013df2a;
    }
  }
  else {
    if (uVar20 == 0x69) {
      if (6 < uVar14) {
        do {
          lVar8 = strtol((char *)((long)pdVar23 + 1),(char **)&local_80,0);
          local_74 = (float)lVar8;
          kputsn_(&local_74,4,&local_48);
          pdVar23 = local_80;
        } while (local_80 < pdVar25);
      }
      goto LAB_0013df2a;
    }
    if (uVar20 == 0x73) {
      if (6 < uVar14) {
        do {
          lVar8 = strtol((char *)((long)pdVar23 + 1),(char **)&local_80,0);
          local_74 = (float)CONCAT22(local_74._2_2_,(short)lVar8);
          kputsn_(&local_74,2,&local_48);
          pdVar23 = local_80;
        } while (local_80 < pdVar25);
      }
      goto LAB_0013df2a;
    }
  }
  if (0 < hts_verbose) {
    local_50 = "[E::%s] unrecognized type\n";
LAB_0013e421:
    fprintf(_stderr,(char *)local_50,"sam_parse1");
    goto LAB_0013dc0d;
  }
LAB_0013df2a:
  puVar18 = (uint8_t *)local_48.s;
  pdVar25 = pdVar24;
  uVar14 = local_48.l;
  if (pkVar15->s + pkVar15->l <= pdVar24) goto LAB_0013e3d4;
  goto LAB_0013de9b;
LAB_0013e3d4:
  iVar17 = (int)uVar14;
  b->data = puVar18;
  iVar6 = 0;
  goto LAB_0013dc20;
code_r0x0013d7b2:
  pdVar25 = (double *)((long)pdVar25 + 1);
  goto LAB_0013d7a0;
}

Assistant:

int sam_parse1(kstring_t *s, bam_hdr_t *h, bam1_t *b)
{
#define _read_token(_p) (_p); for (; *(_p) && *(_p) != '\t'; ++(_p)); if (*(_p) != '\t') goto err_ret; *(_p)++ = 0
#define _read_token_aux(_p) (_p); for (; *(_p) && *(_p) != '\t'; ++(_p)); *(_p)++ = 0 // this is different in that it does not test *(_p)=='\t'
#define _get_mem(type_t, _x, _s, _l) ks_resize((_s), (_s)->l + (_l)); *(_x) = (type_t*)((_s)->s + (_s)->l); (_s)->l += (_l)
#define _parse_err(cond, msg) do { if ((cond) && hts_verbose >= 1) { fprintf(stderr, "[E::%s] " msg "\n", __func__); goto err_ret; } } while (0)
#define _parse_warn(cond, msg) if ((cond) && hts_verbose >= 2) fprintf(stderr, "[W::%s] " msg "\n", __func__)

    uint8_t *t;
    char *p = s->s, *q;
    int i;
    kstring_t str;
    bam1_core_t *c = &b->core;

    str.l = b->l_data = 0;
    str.s = (char*)b->data; str.m = b->m_data;
    memset(c, 0, 32);
    if (h->cigar_tab == 0) {
        h->cigar_tab = (int8_t*) malloc(128);
        for (i = 0; i < 128; ++i)
            h->cigar_tab[i] = -1;
        for (i = 0; BAM_CIGAR_STR[i]; ++i)
            h->cigar_tab[(int)BAM_CIGAR_STR[i]] = i;
    }
    // qname
    q = _read_token(p);
    kputsn_(q, p - q, &str);
    c->l_qname = p - q;
    // flag
    c->flag = strtol(p, &p, 0);
    if (*p++ != '\t') goto err_ret; // malformated flag
    // chr
    q = _read_token(p);
    if (strcmp(q, "*")) {
        _parse_err(h->n_targets == 0, "missing SAM header");
        c->tid = bam_name2id(h, q);
        _parse_warn(c->tid < 0, "urecognized reference name; treated as unmapped");
    } else c->tid = -1;
    // pos
    c->pos = strtol(p, &p, 10) - 1;
    if (*p++ != '\t') goto err_ret;
    if (c->pos < 0 && c->tid >= 0) {
        _parse_warn(1, "mapped query cannot have zero coordinate; treated as unmapped");
        c->tid = -1;
    }
    if (c->tid < 0) c->flag |= BAM_FUNMAP;
    // mapq
    c->qual = strtol(p, &p, 10);
    if (*p++ != '\t') goto err_ret;
    // cigar
    if (*p != '*') {
        uint32_t *cigar;
        size_t n_cigar = 0;
        for (q = p; *p && *p != '\t'; ++p)
            if (!isdigit(*p)) ++n_cigar;
        if (*p++ != '\t') goto err_ret;
        _parse_err(n_cigar >= 65536, "too many CIGAR operations");
        c->n_cigar = n_cigar;
        _get_mem(uint32_t, &cigar, &str, c->n_cigar<<2);
        for (i = 0; i < c->n_cigar; ++i, ++q) {
            int op;
            cigar[i] = strtol(q, &q, 10)<<BAM_CIGAR_SHIFT;
            op = (uint8_t)*q >= 128? -1 : h->cigar_tab[(int)*q];
            _parse_err(op < 0, "unrecognized CIGAR operator");
            cigar[i] |= op;
        }
        i = bam_cigar2rlen(c->n_cigar, cigar);
    } else {
        _parse_warn(!(c->flag&BAM_FUNMAP), "mapped query must have a CIGAR; treated as unmapped");
        c->flag |= BAM_FUNMAP;
        q = _read_token(p);
        i = 1;
    }
    c->bin = hts_reg2bin(c->pos, c->pos + i, 14, 5);
    // mate chr
    q = _read_token(p);
    if (strcmp(q, "=") == 0) c->mtid = c->tid;
    else if (strcmp(q, "*") == 0) c->mtid = -1;
    else c->mtid = bam_name2id(h, q);
    // mpos
    c->mpos = strtol(p, &p, 10) - 1;
    if (*p++ != '\t') goto err_ret;
    if (c->mpos < 0 && c->mtid >= 0) {
        _parse_warn(1, "mapped mate cannot have zero coordinate; treated as unmapped");
        c->mtid = -1;
    }
    // tlen
    c->isize = strtol(p, &p, 10);
    if (*p++ != '\t') goto err_ret;
    // seq
    q = _read_token(p);
    if (strcmp(q, "*")) {
        c->l_qseq = p - q - 1;
        i = bam_cigar2qlen(c->n_cigar, (uint32_t*)(str.s + c->l_qname));
        _parse_err(c->n_cigar && i != c->l_qseq, "CIGAR and query sequence are of different length");
        i = (c->l_qseq + 1) >> 1;
        _get_mem(uint8_t, &t, &str, i);
        memset(t, 0, i);
        for (i = 0; i < c->l_qseq; ++i)
            t[i>>1] |= seq_nt16_table[(int)q[i]] << ((~i&1)<<2);
    } else c->l_qseq = 0;
    // qual
    q = _read_token_aux(p);
    _get_mem(uint8_t, &t, &str, c->l_qseq);
    if (strcmp(q, "*")) {
        _parse_err(p - q - 1 != c->l_qseq, "SEQ and QUAL are of different length");
        for (i = 0; i < c->l_qseq; ++i) t[i] = q[i] - 33;
    } else memset(t, 0xff, c->l_qseq);
    // aux
    // Note that (like the bam1_core_t fields) this aux data in b->data is
    // stored in host endianness; so there is no byte swapping needed here.
    while (p < s->s + s->l) {
        uint8_t type;
        q = _read_token_aux(p); // FIXME: can be accelerated for long 'B' arrays
        _parse_err(p - q - 1 < 6, "incomplete aux field");
        kputsn_(q, 2, &str);
        q += 3; type = *q++; ++q; // q points to value
        if (type == 'A' || type == 'a' || type == 'c' || type == 'C') {
            kputc_('A', &str);
            kputc_(*q, &str);
        } else if (type == 'i' || type == 'I') {
            if (*q == '-') {
                long x = strtol(q, &q, 10);
                if (x >= INT8_MIN) {
                    kputc_('c', &str); kputc_(x, &str);
                } else if (x >= INT16_MIN) {
                    int16_t y = x;
                    kputc_('s', &str); kputsn_((char*)&y, 2, &str);
                } else {
                    int32_t y = x;
                    kputc_('i', &str); kputsn_(&y, 4, &str);
                }
            } else {
                unsigned long x = strtoul(q, &q, 10);
                if (x <= UINT8_MAX) {
                    kputc_('C', &str); kputc_(x, &str);
                } else if (x <= UINT16_MAX) {
                    uint16_t y = x;
                    kputc_('S', &str); kputsn_(&y, 2, &str);
                } else {
                    uint32_t y = x;
                    kputc_('I', &str); kputsn_(&y, 4, &str);
                }
            }
        } else if (type == 'f') {
            float x;
            x = strtod(q, &q);
            kputc_('f', &str); kputsn_(&x, 4, &str);
        } else if (type == 'd') {
            double x;
            x = strtod(q, &q);
            kputc_('d', &str); kputsn_(&x, 8, &str);
        } else if (type == 'Z' || type == 'H') {
            kputc_(type, &str);kputsn_(q, p - q, &str); // note that this include the trailing NULL
        } else if (type == 'B') {
            int32_t n;
            char *r;
            _parse_err(p - q - 1 < 3, "incomplete B-typed aux field");
            type = *q++; // q points to the first ',' following the typing byte
            for (r = q, n = 0; *r; ++r)
                if (*r == ',') ++n;
            kputc_('B', &str); kputc_(type, &str); kputsn_(&n, 4, &str);
            // FIXME: to evaluate which is faster: a) aligned array and then memmove(); b) unaligned array; c) kputsn_()
            if (type == 'c')      while (q + 1 < p) { int8_t   x = strtol(q + 1, &q, 0); kputc_(x, &str); }
            else if (type == 'C') while (q + 1 < p) { uint8_t  x = strtoul(q + 1, &q, 0); kputc_(x, &str); }
            else if (type == 's') while (q + 1 < p) { int16_t  x = strtol(q + 1, &q, 0); kputsn_(&x, 2, &str); }
            else if (type == 'S') while (q + 1 < p) { uint16_t x = strtoul(q + 1, &q, 0); kputsn_(&x, 2, &str); }
            else if (type == 'i') while (q + 1 < p) { int32_t  x = strtol(q + 1, &q, 0); kputsn_(&x, 4, &str); }
            else if (type == 'I') while (q + 1 < p) { uint32_t x = strtoul(q + 1, &q, 0); kputsn_(&x, 4, &str); }
            else if (type == 'f') while (q + 1 < p) { float    x = strtod(q + 1, &q);    kputsn_(&x, 4, &str); }
            else _parse_err(1, "unrecognized type");
        } else _parse_err(1, "unrecognized type");
    }
    b->data = (uint8_t*)str.s; b->l_data = str.l; b->m_data = str.m;
    return 0;

#undef _parse_warn
#undef _parse_err
#undef _get_mem
#undef _read_token_aux
#undef _read_token
err_ret:
    b->data = (uint8_t*)str.s; b->l_data = str.l; b->m_data = str.m;
    return -2;
}